

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

void If_DsdManTest(void)

{
  Vec_Int_t *p;
  word local_8;
  
  local_8 = Abc_Tt6Stretch(0x5277,4);
  p = Dau_DecFindSets(&local_8,6);
  Vec_IntFree(p);
  return;
}

Assistant:

void If_DsdManTest()
{
    Vec_Int_t * vSets;
    word t = 0x5277;
    t = Abc_Tt6Stretch( t, 4 );
//    word t = 0xD9D900D900D900001010001000100000;
    vSets = Dau_DecFindSets( &t, 6 );
    Vec_IntFree( vSets );
}